

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

bool __thiscall GrcManager::StorePseudoToActualAsGlyphAttr(GrcManager *this)

{
  GrcSymbolTable *this_00;
  Symbol pGVar1;
  allocator local_39;
  string local_38;
  
  this_00 = this->m_psymtbl;
  std::__cxx11::string::string((string *)&local_38,"*actualForPseudo*",&local_39);
  pGVar1 = GrcSymbolTable::FindSymbol(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  GdlRenderer::StorePseudoToActualAsGlyphAttr
            (this->m_prndr,this->m_pgax,pGVar1->m_nInternalID,&this->m_vpexpModified);
  return true;
}

Assistant:

bool GrcManager::StorePseudoToActualAsGlyphAttr()
{
	Symbol psym = m_psymtbl->FindSymbol("*actualForPseudo*");
	Assert(psym);
	int nAttrID = psym->InternalID();

	m_prndr->StorePseudoToActualAsGlyphAttr(m_pgax, nAttrID, m_vpexpModified);

	return true;
}